

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

void helicsInputAddTarget(HelicsInput ipt,char *target,HelicsError *err)

{
  Input *this;
  HelicsInput pvVar1;
  size_t sVar2;
  string_view target_00;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (ipt == (HelicsInput)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a8c7a;
    }
    else {
      pvVar1 = (HelicsInput)0x0;
      if (*ipt == 0x3456e052) {
        pvVar1 = ipt;
      }
      if (*ipt == 0x3456e052 || err == (HelicsError *)0x0) goto LAB_001a8c7c;
    }
    err->error_code = -3;
    err->message = "The given input object does not point to a valid object";
  }
LAB_001a8c7a:
  pvVar1 = (HelicsInput)0x0;
LAB_001a8c7c:
  if (pvVar1 != (HelicsInput)0x0) {
    if (target != (char *)0x0) {
      this = *(Input **)((long)pvVar1 + 0x18);
      sVar2 = strlen(target);
      target_00._M_str = target;
      target_00._M_len = sVar2;
      helics::Input::addPublication(this,target_00);
      return;
    }
    if (err != (HelicsError *)0x0) {
      err->error_code = -4;
      err->message = "The supplied string argument is null and therefore invalid";
    }
  }
  return;
}

Assistant:

void helicsInputAddTarget(HelicsInput ipt, const char* target, HelicsError* err)
{
    auto* inpObj = verifyInput(ipt, err);
    if (inpObj == nullptr) {
        return;
    }
    CHECK_NULL_STRING(target, void());
    inpObj->inputPtr->addTarget(target);
}